

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

void __thiscall
AddrManImpl::Serialize<HashedSourceWriter<AutoFile>>
          (AddrManImpl *this,HashedSourceWriter<AutoFile> *s_)

{
  nid_type *pnVar1;
  HashedSourceWriter<AutoFile> *pHVar2;
  mapped_type *pmVar3;
  long lVar4;
  __native_type *__n;
  _Hash_node_base *p_Var5;
  int bucket;
  int iVar6;
  long lVar7;
  nid_type (*panVar8) [64];
  long in_FS_OFFSET;
  int iVar9;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  mapUnkIds;
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> s;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  undefined1 local_b0 [32];
  float local_90;
  undefined1 local_88 [16];
  ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> local_78;
  unique_lock<std::mutex> local_68;
  __native_type local_58;
  
  local_58.__data.__list.__next = (__pthread_internal_list *)*(long *)(in_FS_OFFSET + 0x28);
  local_68._M_owns = false;
  __n = (__native_type *)this;
  local_68._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_68);
  local_78.m_params = &CAddress::V2_DISK;
  local_b0[0] = (_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 )0x4;
  local_78.m_substream = s_;
  AutoFile::write(s_->m_source,(int)local_b0,(void *)0x1,(size_t)__n);
  CSHA256::Write((CSHA256 *)s_,local_b0,1);
  pHVar2 = local_78.m_substream;
  local_b0[0] = (_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 )0x24;
  AutoFile::write((local_78.m_substream)->m_source,(int)local_b0,(void *)0x1,(size_t)__n);
  CSHA256::Write((CSHA256 *)pHVar2,local_b0,1);
  pHVar2 = local_78.m_substream;
  AutoFile::write((local_78.m_substream)->m_source,(int)&this->nKey,(void *)0x20,(size_t)__n);
  CSHA256::Write((CSHA256 *)pHVar2,(uchar *)&this->nKey,0x20);
  pHVar2 = local_78.m_substream;
  local_b0._0_4_ = this->nNew;
  AutoFile::write((local_78.m_substream)->m_source,(int)local_b0,(void *)0x4,(size_t)__n);
  CSHA256::Write((CSHA256 *)pHVar2,local_b0,4);
  pHVar2 = local_78.m_substream;
  local_b0._0_4_ = this->nTried;
  AutoFile::write((local_78.m_substream)->m_source,(int)local_b0,(void *)0x4,(size_t)__n);
  CSHA256::Write((CSHA256 *)pHVar2,local_b0,4);
  pHVar2 = local_78.m_substream;
  local_b0._0_4_ = 0x40000400;
  AutoFile::write((local_78.m_substream)->m_source,(int)local_b0,(void *)0x4,(size_t)__n);
  CSHA256::Write((CSHA256 *)pHVar2,local_b0,4);
  local_b0._0_8_ = local_88 + 8;
  local_b0._8_8_ = 1;
  local_b0._16_16_ = (undefined1  [16])0x0;
  local_90 = 1.0;
  local_88 = (undefined1  [16])0x0;
  p_Var5 = (this->mapInfo)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    iVar6 = 0;
    do {
      pmVar3 = std::__detail::
               _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_b0,(key_type *)(p_Var5 + 1));
      *pmVar3 = iVar6;
      if (*(int *)((long)&p_Var5[0x10]._M_nxt + 4) != 0) {
        if (iVar6 == this->nNew) {
          __assert_fail("nIds != nNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                        ,0xc5,
                        "void AddrManImpl::Serialize(Stream &) const [Stream = HashedSourceWriter<AutoFile>]"
                       );
        }
        local_58.__align = (long)(p_Var5 + 0xf);
        __n = &local_58;
        SerializeMany<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress,CNetAddr,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>,int>
                  (&local_78,(CAddress *)(p_Var5 + 2),(CNetAddr *)(p_Var5 + 0xb),
                   (Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                    *)&local_58.__data,(int *)(p_Var5 + 0x10));
        iVar6 = iVar6 + 1;
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
    p_Var5 = (this->mapInfo)._M_h._M_before_begin._M_nxt;
    if (p_Var5 != (_Hash_node_base *)0x0) {
      iVar6 = 0;
      do {
        if (*(char *)&p_Var5[0x11]._M_nxt == '\x01') {
          if (iVar6 == this->nTried) {
            __assert_fail("nIds != nTried",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                          ,0xce,
                          "void AddrManImpl::Serialize(Stream &) const [Stream = HashedSourceWriter<AutoFile>]"
                         );
          }
          local_58.__align = (long)(p_Var5 + 0xf);
          __n = &local_58;
          SerializeMany<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,CAddress,CNetAddr,Wrapper<ChronoFormatter<long,false>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>const&>,int>
                    (&local_78,(CAddress *)(p_Var5 + 2),(CNetAddr *)(p_Var5 + 0xb),
                     (Wrapper<ChronoFormatter<long,_false>,_const_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_&>
                      *)&local_58.__data,(int *)(p_Var5 + 0x10));
          iVar6 = iVar6 + 1;
        }
        p_Var5 = p_Var5->_M_nxt;
      } while (p_Var5 != (_Hash_node_base *)0x0);
    }
  }
  panVar8 = this->vvNew;
  lVar7 = 0;
  do {
    pHVar2 = local_78.m_substream;
    iVar6 = 0;
    iVar9 = 0;
    lVar4 = 0;
    do {
      pnVar1 = *panVar8 + lVar4;
      iVar6 = (iVar6 - (uint)((int)*pnVar1 == -1 && *(int *)((long)pnVar1 + 4) == -1)) + 1;
      iVar9 = (iVar9 - (uint)((int)pnVar1[1] == -1 && *(int *)((long)pnVar1 + 0xc) == -1)) + 1;
      lVar4 = lVar4 + 2;
    } while (lVar4 != 0x40);
    local_58.__data.__lock = iVar9 + iVar6;
    iVar6 = (int)&local_58;
    AutoFile::write((local_78.m_substream)->m_source,iVar6,(void *)0x4,(size_t)__n);
    CSHA256::Write((CSHA256 *)pHVar2,(uchar *)local_58.__size,4);
    lVar4 = 0;
    do {
      if (*(long *)((long)*panVar8 + lVar4) != -1) {
        pmVar3 = std::__detail::
                 _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_b0,(key_type *)((long)*panVar8 + lVar4));
        pHVar2 = local_78.m_substream;
        local_58.__data.__lock = *pmVar3;
        AutoFile::write((local_78.m_substream)->m_source,iVar6,(void *)0x4,(size_t)__n);
        CSHA256::Write((CSHA256 *)pHVar2,(uchar *)local_58.__size,4);
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 0x200);
    lVar7 = lVar7 + 1;
    panVar8 = panVar8 + 1;
  } while (lVar7 != 0x400);
  NetGroupManager::GetAsmapChecksum((uint256 *)&local_58.__data,this->m_netgroupman);
  pHVar2 = local_78.m_substream;
  AutoFile::write((local_78.m_substream)->m_source,(int)&local_58,(void *)0x20,(size_t)__n);
  CSHA256::Write((CSHA256 *)pHVar2,(uchar *)local_58.__size,0x20);
  std::
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_b0);
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == local_58.__data.__list.__next) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AddrManImpl::Serialize(Stream& s_) const
{
    LOCK(cs);

    /**
     * Serialized format.
     * * format version byte (@see `Format`)
     * * lowest compatible format version byte. This is used to help old software decide
     *   whether to parse the file. For example:
     *   * Bitcoin Core version N knows how to parse up to format=3. If a new format=4 is
     *     introduced in version N+1 that is compatible with format=3 and it is known that
     *     version N will be able to parse it, then version N+1 will write
     *     (format=4, lowest_compatible=3) in the first two bytes of the file, and so
     *     version N will still try to parse it.
     *   * Bitcoin Core version N+2 introduces a new incompatible format=5. It will write
     *     (format=5, lowest_compatible=5) and so any versions that do not know how to parse
     *     format=5 will not try to read the file.
     * * nKey
     * * nNew
     * * nTried
     * * number of "new" buckets XOR 2**30
     * * all new addresses (total count: nNew)
     * * all tried addresses (total count: nTried)
     * * for each new bucket:
     *   * number of elements
     *   * for each element: index in the serialized "all new addresses"
     * * asmap checksum
     *
     * 2**30 is xorred with the number of buckets to make addrman deserializer v0 detect it
     * as incompatible. This is necessary because it did not check the version number on
     * deserialization.
     *
     * vvNew, vvTried, mapInfo, mapAddr and vRandom are never encoded explicitly;
     * they are instead reconstructed from the other information.
     *
     * This format is more complex, but significantly smaller (at most 1.5 MiB), and supports
     * changes to the ADDRMAN_ parameters without breaking the on-disk structure.
     *
     * We don't use SERIALIZE_METHODS since the serialization and deserialization code has
     * very little in common.
     */

    // Always serialize in the latest version (FILE_FORMAT).
    ParamsStream s{s_, CAddress::V2_DISK};

    s << static_cast<uint8_t>(FILE_FORMAT);

    // Increment `lowest_compatible` iff a newly introduced format is incompatible with
    // the previous one.
    static constexpr uint8_t lowest_compatible = Format::V4_MULTIPORT;
    s << static_cast<uint8_t>(INCOMPATIBILITY_BASE + lowest_compatible);

    s << nKey;
    s << nNew;
    s << nTried;

    int nUBuckets = ADDRMAN_NEW_BUCKET_COUNT ^ (1 << 30);
    s << nUBuckets;
    std::unordered_map<nid_type, int> mapUnkIds;
    int nIds = 0;
    for (const auto& entry : mapInfo) {
        mapUnkIds[entry.first] = nIds;
        const AddrInfo& info = entry.second;
        if (info.nRefCount) {
            assert(nIds != nNew); // this means nNew was wrong, oh ow
            s << info;
            nIds++;
        }
    }
    nIds = 0;
    for (const auto& entry : mapInfo) {
        const AddrInfo& info = entry.second;
        if (info.fInTried) {
            assert(nIds != nTried); // this means nTried was wrong, oh ow
            s << info;
            nIds++;
        }
    }
    for (int bucket = 0; bucket < ADDRMAN_NEW_BUCKET_COUNT; bucket++) {
        int nSize = 0;
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[bucket][i] != -1)
                nSize++;
        }
        s << nSize;
        for (int i = 0; i < ADDRMAN_BUCKET_SIZE; i++) {
            if (vvNew[bucket][i] != -1) {
                int nIndex = mapUnkIds[vvNew[bucket][i]];
                s << nIndex;
            }
        }
    }
    // Store asmap checksum after bucket entries so that it
    // can be ignored by older clients for backward compatibility.
    s << m_netgroupman.GetAsmapChecksum();
}